

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_xmlwriter.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[5]>(XmlWriter *this,string *name,char (*attribute) [5])

{
  ostream *poVar1;
  size_t sVar2;
  
  if (name->_M_string_length != 0) {
    poVar1 = this->m_os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
    sVar2 = strlen(*attribute);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,*attribute,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  }
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            if( !name.empty() )
                stream() << " " << name << "=\"" << attribute << "\"";
            return *this;
        }